

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddSymm.c
# Opt level: O0

DdNode * Extra_zddSelectOneSubset(DdManager *dd,DdNode *zS)

{
  DdNode *pDVar1;
  DdNode *res;
  DdNode *zS_local;
  DdManager *dd_local;
  
  do {
    dd->reordered = 0;
    pDVar1 = extraZddSelectOneSubset(dd,zS);
  } while (dd->reordered == 1);
  return pDVar1;
}

Assistant:

DdNode* Extra_zddSelectOneSubset( 
  DdManager * dd,   /* the DD manager */
  DdNode * zS)      /* the ZDD */
{
    DdNode  *res;
    do {
        dd->reordered = 0;
        res = extraZddSelectOneSubset(dd, zS);
    } while (dd->reordered == 1);
    return(res);

}